

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_3.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Pool *pPVar1;
  void *pvVar2;
  NoActionMemLogger logger;
  CachedArena<cookmem::MmapArena> cachedArena;
  MmapArena arena;
  MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void> local_288;
  
  cachedArena.m_arena = &arena;
  arena.m_minSize = 0x10000;
  arena.m_prot = 3;
  arena.m_flag = 0x22;
  cachedArena.m_tree.m_root = (Node *)0x0;
  pPVar1 = &local_288.m_pool;
  local_288._vptr_MemContext = (_func_int **)&PTR__MemContext_00104d90;
  local_288.m_arena = &cachedArena;
  local_288.m_logger = &logger;
  local_288.m_pool.m_arena = &cachedArena;
  local_288.m_pool.m_logger = &logger;
  memset(&local_288.m_pool.m_footprintLimit,0,0x232);
  local_288.m_pool.m_paddingByte = -0x33;
  pvVar2 = cookmem::
           MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
           allocate(pPVar1,100);
  pvVar2 = cookmem::
           MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
           reallocate(pPVar1,pvVar2,1000);
  cookmem::MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
  deallocate(pPVar1,pvVar2,0);
  cookmem::MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
  ~MemContext(&local_288);
  local_288._vptr_MemContext = (_func_int **)&PTR__MemContext_00104d90;
  pPVar1 = &local_288.m_pool;
  local_288.m_arena = &cachedArena;
  local_288.m_logger = &logger;
  local_288.m_pool.m_arena = &cachedArena;
  local_288.m_pool.m_logger = &logger;
  memset(&local_288.m_pool.m_footprintLimit,0,0x232);
  local_288.m_pool.m_paddingByte = -0x33;
  pvVar2 = cookmem::
           MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
           allocate(pPVar1,100);
  pvVar2 = cookmem::
           MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
           reallocate(pPVar1,pvVar2,1000);
  cookmem::MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
  deallocate(pPVar1,pvVar2,0);
  cookmem::MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
  ~MemContext(&local_288);
  return 0;
}

Assistant:

int
main (int argc, const char* argv[])
{
    cookmem::MmapArena arena;
    cookmem::CachedArena<cookmem::MmapArena> cachedArena (arena);
    cookmem::NoActionMemLogger logger;

    typedef cookmem::MemContext<cookmem::CachedArena<cookmem::MmapArena>, cookmem::NoActionMemLogger> CachedMemCtx;

    {
        CachedMemCtx memCtx (cachedArena, logger);

        // Allocate memory
        void* ptr = memCtx.allocate (100);

        // Change the size of the memory
        ptr = memCtx.reallocate (ptr, 1000);

        // Free the memory
        memCtx.deallocate (ptr);

        // Destructor of MemContext is called to release all allocated memory
        // segments back to cachedArena
    }

    {
        CachedMemCtx memCtx (cachedArena, logger);

        // Allocate memory.  The memory segment saved in cachedArena are re-used.
        void* ptr = memCtx.allocate (100);

        // Change the size of the memory
        ptr = memCtx.reallocate (ptr, 1000);

        // Free the memory
        memCtx.deallocate (ptr);

        // Destructor of MemContext is called to release all allocated memory
        // segments back to cachedArena
    }
    return 0;
}